

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mpi_get_digit(mbedtls_mpi_uint *d,int radix,char c)

{
  char c_local;
  int radix_local;
  mbedtls_mpi_uint *d_local;
  undefined4 local_4;
  
  *d = 0xff;
  if (('/' < c) && (c < ':')) {
    *d = (long)(c + -0x30);
  }
  if (('@' < c) && (c < 'G')) {
    *d = (long)(c + -0x37);
  }
  if (('`' < c) && (c < 'g')) {
    *d = (long)(c + -0x57);
  }
  if (*d < (ulong)(long)radix) {
    local_4 = 0;
  }
  else {
    local_4 = -6;
  }
  return local_4;
}

Assistant:

static int mpi_get_digit(mbedtls_mpi_uint *d, int radix, char c)
{
    *d = 255;

    if (c >= 0x30 && c <= 0x39) {
        *d = c - 0x30;
    }
    if (c >= 0x41 && c <= 0x46) {
        *d = c - 0x37;
    }
    if (c >= 0x61 && c <= 0x66) {
        *d = c - 0x57;
    }

    if (*d >= (mbedtls_mpi_uint) radix) {
        return MBEDTLS_ERR_MPI_INVALID_CHARACTER;
    }

    return 0;
}